

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O3

char * Fantasy_ReorderedEnum_parse_json_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_sign,uint64_t *value,
                 int *aggregate)

{
  char *pcVar1;
  ulong uVar2;
  uint64_t uVar3;
  
  if ((ulong)((long)end - (long)buf) < 8) {
    uVar2 = 0;
    switch((long)end - (long)buf) {
    case 7:
      uVar2 = (long)buf[6] << 8;
    case 6:
      uVar2 = uVar2 | (long)buf[5] << 0x10;
    case 5:
      uVar2 = uVar2 | (long)buf[4] << 0x18;
    case 4:
      uVar2 = uVar2 | (long)buf[3] << 0x20;
    case 3:
      uVar2 = uVar2 | (long)buf[2] << 0x28;
    case 2:
      uVar2 = uVar2 | (long)buf[1] << 0x30;
    case 1:
      uVar2 = (ulong)(byte)*buf << 0x38 | uVar2;
      break;
    default:
      goto switchD_0010f2bf_default;
    }
  }
  else {
    uVar2 = (*(ulong *)buf & 0xff00) << 0x28 | *(ulong *)buf << 0x38;
  }
  if ((ushort)(uVar2 >> 0x30) < 0x7279) {
    if ((uVar2 & 0x7fff000000000000) != 0x7278000000000000) {
      return buf;
    }
    pcVar1 = flatcc_json_parser_match_constant(ctx,buf,end,2,aggregate);
    if (pcVar1 == buf) {
      return buf;
    }
    uVar3 = 10;
  }
  else if ((uVar2 & 0xffff000000000000) == 0x7279000000000000) {
    pcVar1 = flatcc_json_parser_match_constant(ctx,buf,end,2,aggregate);
    if (pcVar1 == buf) {
      return buf;
    }
    uVar3 = 1;
  }
  else {
    if ((uVar2 & 0xffff000000000000) != 0x727a000000000000) {
      return buf;
    }
    pcVar1 = flatcc_json_parser_match_constant(ctx,buf,end,2,aggregate);
    if (pcVar1 == buf) {
      return buf;
    }
    uVar3 = 9;
  }
  *value = uVar3;
  *value_sign = 0;
  buf = pcVar1;
switchD_0010f2bf_default:
  return buf;
}

Assistant:

static const char *Fantasy_ReorderedEnum_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_sign, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if (w < 0x7279000000000000) { /* branch "ry" */
        if ((w & 0xffff000000000000) == 0x7278000000000000) { /* "rx" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 2, aggregate);
            if (buf != mark) {
                *value = UINT64_C(10), *value_sign = 0;
            } else {
                return unmatched;
            }
        } else { /* "rx" */
            return unmatched;
        } /* "rx" */
    } else { /* branch "ry" */
        if ((w & 0xffff000000000000) == 0x727a000000000000) { /* "rz" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 2, aggregate);
            if (buf != mark) {
                *value = UINT64_C(9), *value_sign = 0;
            } else {
                return unmatched;
            }
        } else { /* "rz" */
            if ((w & 0xffff000000000000) == 0x7279000000000000) { /* "ry" */
                buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 2, aggregate);
                if (buf != mark) {
                    *value = UINT64_C(1), *value_sign = 0;
                } else {
                    return unmatched;
                }
            } else { /* "ry" */
                return unmatched;
            } /* "ry" */
        } /* "rz" */
    } /* branch "ry" */
    return buf;
}